

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O2

void set_switch(ecs_world_t *world,ecs_table_t *table,ecs_data_t *data,int32_t row,int32_t count,
               ecs_entities_t *entities,_Bool reset)

{
  ecs_entity_t *peVar1;
  ecs_switch_t *sw;
  int32_t iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uint64_t value;
  ulong add;
  bool bVar6;
  
  peVar1 = entities->array;
  uVar5 = 0;
  if (count < 1) {
    count = 0;
  }
  uVar3 = (ulong)(uint)entities->count;
  if (entities->count < 1) {
    uVar3 = uVar5;
  }
  do {
    if (uVar5 == uVar3) {
      return;
    }
    if ((char)(peVar1[uVar5] >> 0x38) == -4) {
      add = peVar1[uVar5] & 0xffffffffffffff;
      if (reset) {
        value = 0;
      }
      else {
        _ecs_assert(add != 0,0xc,(char *)0x0,"sw_case != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x314);
        value = add;
        if (add == 0) {
          __assert_fail("sw_case != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                        ,0x314,
                        "void set_switch(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_entities_t *, _Bool)"
                       );
        }
      }
      iVar2 = ecs_table_switch_from_case(world,table,add);
      _ecs_assert(iVar2 != -1,0xc,(char *)0x0,"sw_index != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x318);
      if (iVar2 == -1) {
        __assert_fail("sw_index != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x318,
                      "void set_switch(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_entities_t *, _Bool)"
                     );
      }
      sw = data->sw_columns[iVar2].data;
      _ecs_assert(sw != (ecs_switch_t *)0x0,0xc,(char *)0x0,"sw != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x31a);
      iVar2 = row;
      iVar4 = count;
      if (sw == (ecs_switch_t *)0x0) {
        __assert_fail("sw != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x31a,
                      "void set_switch(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_entities_t *, _Bool)"
                     );
      }
      while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
        ecs_switch_set(sw,iVar2,value);
        iVar2 = iVar2 + 1;
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static
void set_switch(
    ecs_world_t *world,
    ecs_table_t *table,
    ecs_data_t * data,
    int32_t row,
    int32_t count,    
    ecs_entities_t *entities,
    bool reset)
{
    ecs_entity_t *array = entities->array;
    int32_t i, comp_count = entities->count;

    for (i = 0; i < comp_count; i ++) {
        ecs_entity_t e = array[i];

        if (ECS_HAS_ROLE(e, CASE)) {
            e = e & ECS_COMPONENT_MASK;

            ecs_entity_t sw_case = 0;
            if (!reset) {
                sw_case = e;
                ecs_assert(sw_case != 0, ECS_INTERNAL_ERROR, NULL);
            }

            int32_t sw_index = ecs_table_switch_from_case(world, table, e);
            ecs_assert(sw_index != -1, ECS_INTERNAL_ERROR, NULL);
            ecs_switch_t *sw = data->sw_columns[sw_index].data;
            ecs_assert(sw != NULL, ECS_INTERNAL_ERROR, NULL);
            
            int32_t r;
            for (r = 0; r < count; r ++) {
                ecs_switch_set(sw, row + r, sw_case);
            }
        }
    }
}